

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::builtins::AssertControlTask::bindArgument
          (AssertControlTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  bool bVar1;
  Compilation *this_00;
  Compilation *compilation;
  Expression *pEVar2;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  Args *pAVar3;
  
  bVar1 = argIndex != 0;
  if ((this->super_SystemTaskBase).super_SystemSubroutine.field_0x34 != '\0') {
    bVar1 = 3 < argIndex;
  }
  if (bVar1) {
    pAVar3 = args;
    bVar1 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    extraLookupFlags.m_bits = (underlying_type)pAVar3;
    if (bVar1) {
      this_00 = ASTContext::getCompilation(context);
      compilation = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                              (&syntax->super_SyntaxNode);
      pEVar2 = HierarchicalReferenceExpression::fromSyntax
                         ((HierarchicalReferenceExpression *)this_00,compilation,
                          (NameSyntax *)context,(ASTContext *)0x0,extraLookupFlags);
      return pEVar2;
    }
  }
  pEVar2 = SystemSubroutine::bindArgument((SystemSubroutine *)this,argIndex,context,syntax,args);
  return pEVar2;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if ((isFullMethod && argIndex < 4) || (!isFullMethod && argIndex == 0) ||
            !NameSyntax::isKind(syntax.kind)) {
            return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
        }

        return HierarchicalReferenceExpression::fromSyntax(context.getCompilation(),
                                                           syntax.as<NameSyntax>(), context);
    }